

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
~basic_json_encoder(basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
                    *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer peVar3;
  pointer pcVar4;
  
  stream_sink<char>::flush(&this->sink_);
  pcVar2 = (this->close_array_bracket_str_)._M_dataplus._M_p;
  paVar1 = &(this->close_array_bracket_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->open_array_bracket_str_)._M_dataplus._M_p;
  paVar1 = &(this->open_array_bracket_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->close_object_brace_str_)._M_dataplus._M_p;
  paVar1 = &(this->close_object_brace_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->open_object_brace_str_)._M_dataplus._M_p;
  paVar1 = &(this->open_object_brace_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->comma_str_)._M_dataplus._M_p;
  paVar1 = &(this->comma_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->colon_str_)._M_dataplus._M_p;
  paVar1 = &(this->colon_str_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  peVar3 = (this->stack_).
           super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (peVar3 != (pointer)0x0) {
    operator_delete(peVar3,(long)(this->stack_).
                                 super__Vector_base<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)peVar3);
  }
  pcVar4 = (this->fp_).to_double_.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar4 != (pointer)0x0) {
    operator_delete(pcVar4,(long)(this->fp_).to_double_.buffer_.
                                 super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pcVar4);
  }
  basic_json_encode_options<char>::~basic_json_encode_options
            (&this->options_,&basic_json_encode_options<char>::VTT);
  basic_json_options_common<char>::~basic_json_options_common
            ((basic_json_options_common<char> *)&(this->options_).field_0x40);
  stream_sink<char>::~stream_sink(&this->sink_);
  return;
}

Assistant:

~basic_json_encoder() noexcept
        {
            JSONCONS_TRY
            {
                sink_.flush();
            }